

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O2

int nn_sock_send(nn_sock *self,nn_msg *msg,int flags)

{
  FILE *__stream;
  uint uVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  char *pcVar5;
  nn_ctx *self_00;
  long lVar6;
  ulong uVar7;
  
  if ((self->socktype->flags & 2) == 0) {
    self_00 = &self->ctx;
    nn_ctx_enter(self_00);
    if (self->sndtimeo < 0) {
      lVar6 = -1;
      uVar7 = 0xffffffffffffffff;
    }
    else {
      uVar4 = nn_clock_ms();
      lVar6 = (long)self->sndtimeo;
      uVar7 = uVar4 + lVar6;
    }
    while (uVar1 = self->state - 3, 3 < uVar1) {
      iVar2 = (*self->sockbase->vfptr->send)(self->sockbase,msg);
      iVar3 = 0;
      if (iVar2 == 0) goto LAB_001132b3;
      if (-1 < iVar2) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/sock.c"
                ,0x27b);
LAB_00113307:
        fflush(_stderr);
        nn_err_abort();
      }
      nn_ctx_leave(self_00);
      if (iVar2 != -0xb || (flags & 1U) != 0) {
        return iVar2;
      }
      uVar1 = nn_efd_wait(&self->sndfd,(int)lVar6);
      __stream = _stderr;
      if (uVar1 != 0) {
        if (uVar1 == 0xffffff92) {
          return -0x6e;
        }
        if (uVar1 == 0xfffffffc) {
          return -4;
        }
        if (uVar1 == 0xfffffff7) {
          return -9;
        }
        pcVar5 = nn_err_strerror(uVar1);
        fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar5,(ulong)uVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/sock.c"
                ,0x294);
        goto LAB_00113307;
      }
      nn_ctx_enter(self_00);
      iVar3 = nn_efd_wait(&self->sndfd,0);
      if (iVar3 == 0) {
        *(byte *)&self->flags = (byte)self->flags | 2;
      }
      if (-1 < self->sndtimeo) {
        uVar4 = nn_clock_ms();
        lVar6 = 0;
        if (uVar4 <= uVar7) {
          lVar6 = uVar7 - uVar4;
        }
      }
    }
    iVar3 = *(int *)(&DAT_0012d450 + (ulong)uVar1 * 4);
LAB_001132b3:
    nn_ctx_leave(self_00);
  }
  else {
    iVar3 = -0x5f;
  }
  return iVar3;
}

Assistant:

int nn_sock_send (struct nn_sock *self, struct nn_msg *msg, int flags)
{
    int rc;
    uint64_t deadline;
    uint64_t now;
    int timeout;

    /*  Some sockets types cannot be used for sending messages. */
    if (nn_slow (self->socktype->flags & NN_SOCKTYPE_FLAG_NOSEND))
        return -ENOTSUP;

    nn_ctx_enter (&self->ctx);

    /*  Compute the deadline for SNDTIMEO timer. */
    if (self->sndtimeo < 0) {
        deadline = -1;
        timeout = -1;
    }
    else {
        deadline = nn_clock_ms() + self->sndtimeo;
        timeout = self->sndtimeo;
    }

    while (1) {

        switch (self->state) {
        case NN_SOCK_STATE_ACTIVE:
        case NN_SOCK_STATE_INIT:
             break;

        case NN_SOCK_STATE_ZOMBIE:
            /*  If nn_term() was already called, return ETERM. */
            nn_ctx_leave (&self->ctx);
            return -ETERM;

        case NN_SOCK_STATE_STOPPING_EPS:
        case NN_SOCK_STATE_STOPPING:
        case NN_SOCK_STATE_FINI:
            /*  Socket closed or closing.  Should we return something
                else here; recvmsg(2) for example returns no data in
                this case, like read(2).  The use of indexed file
                descriptors is further problematic, as an FD can be reused
                leading to situations where technically the outstanding
                operation should refer to some other socket entirely.  */
            nn_ctx_leave (&self->ctx);
            return -EBADF;
        }

        /*  Try to send the message in a non-blocking way. */
        rc = self->sockbase->vfptr->send (self->sockbase, msg);
        if (nn_fast (rc == 0)) {
            nn_ctx_leave (&self->ctx);
            return 0;
        }
        nn_assert (rc < 0);

        /*  Any unexpected error is forwarded to the caller. */
        if (nn_slow (rc != -EAGAIN)) {
            nn_ctx_leave (&self->ctx);
            return rc;
        }

        /*  If the message cannot be sent at the moment and the send call
            is non-blocking, return immediately. */
        if (nn_fast (flags & NN_DONTWAIT)) {
            nn_ctx_leave (&self->ctx);
            return -EAGAIN;
        }

        /*  With blocking send, wait while there are new pipes available
            for sending. */
        nn_ctx_leave (&self->ctx);
        rc = nn_efd_wait (&self->sndfd, timeout);
        if (nn_slow (rc == -ETIMEDOUT))
            return -ETIMEDOUT;
        if (nn_slow (rc == -EINTR))
            return -EINTR;
        if (nn_slow (rc == -EBADF))
            return -EBADF;
        errnum_assert (rc == 0, rc);
        nn_ctx_enter (&self->ctx);
        /*
         *  Double check if pipes are still available for sending
         */
        if (!nn_efd_wait (&self->sndfd, 0)) {
            self->flags |= NN_SOCK_FLAG_OUT;
        }

        /*  If needed, re-compute the timeout to reflect the time that have
            already elapsed. */
        if (self->sndtimeo >= 0) {
            now = nn_clock_ms();
            timeout = (int) (now > deadline ? 0 : deadline - now);
        }
    }
}